

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int uv_tcp_init_ex(uv_loop_t *loop,uv_tcp_t *tcp,uint flags)

{
  uint domain_00;
  int err;
  int domain;
  uint flags_local;
  uv_tcp_t *tcp_local;
  uv_loop_t *loop_local;
  
  domain_00 = flags & 0xff;
  if (((domain_00 == 2) || (domain_00 == 10)) || (domain_00 == 0)) {
    if ((flags & 0xffffff00) == 0) {
      uv__stream_init(loop,(uv_stream_t *)tcp,UV_TCP);
      if ((domain_00 == 0) ||
         (loop_local._4_4_ = maybe_new_socket(tcp,domain_00,0), loop_local._4_4_ == 0)) {
        loop_local._4_4_ = 0;
      }
      else {
        *(void **)tcp->handle_queue[1] = tcp->handle_queue[0];
        *(void **)((long)tcp->handle_queue[0] + 8) = tcp->handle_queue[1];
      }
    }
    else {
      loop_local._4_4_ = -0x16;
    }
  }
  else {
    loop_local._4_4_ = -0x16;
  }
  return loop_local._4_4_;
}

Assistant:

int uv_tcp_init_ex(uv_loop_t* loop, uv_tcp_t* tcp, unsigned int flags) {
  int domain;

  /* Use the lower 8 bits for the domain */
  domain = flags & 0xFF;
  if (domain != AF_INET && domain != AF_INET6 && domain != AF_UNSPEC)
    return UV_EINVAL;

  if (flags & ~0xFF)
    return UV_EINVAL;

  uv__stream_init(loop, (uv_stream_t*)tcp, UV_TCP);

  /* If anything fails beyond this point we need to remove the handle from
   * the handle queue, since it was added by uv__handle_init in uv_stream_init.
   */

  if (domain != AF_UNSPEC) {
    int err = maybe_new_socket(tcp, domain, 0);
    if (err) {
      QUEUE_REMOVE(&tcp->handle_queue);
      return err;
    }
  }

  return 0;
}